

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllContentModel.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::AllContentModel::buildChildList
          (AllContentModel *this,ContentSpecNode *curNode,
          ValueVectorOf<xercesc_4_0::QName_*> *toFill,ValueVectorOf<bool> *toOptional)

{
  ValueVectorOf<bool> *pVVar1;
  NodeTypes NVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  RuntimeException *pRVar6;
  ContentSpecNode *pCVar7;
  bool local_a1;
  QName *local_a0;
  bool local_91;
  QName *local_90;
  int local_84;
  ContentSpecNode *pCStack_80;
  int i;
  ContentSpecNode *leftNode_2;
  QName *local_70 [3];
  ContentSpecNode *local_58;
  ContentSpecNode *leftNode_1;
  QName *local_48;
  ContentSpecNode *local_40;
  ContentSpecNode *rightNode;
  ContentSpecNode *leftNode;
  ValueVectorOf<bool> *pVStack_28;
  NodeTypes curType;
  ValueVectorOf<bool> *toOptional_local;
  ValueVectorOf<xercesc_4_0::QName_*> *toFill_local;
  ContentSpecNode *curNode_local;
  AllContentModel *this_local;
  
  pVStack_28 = toOptional;
  toOptional_local = (ValueVectorOf<bool> *)toFill;
  toFill_local = (ValueVectorOf<xercesc_4_0::QName_*> *)curNode;
  curNode_local = (ContentSpecNode *)this;
  leftNode._4_4_ = ContentSpecNode::getType(curNode);
  pVVar1 = toOptional_local;
  if (leftNode._4_4_ == All) {
    rightNode = ContentSpecNode::getFirst((ContentSpecNode *)toFill_local);
    local_40 = ContentSpecNode::getSecond((ContentSpecNode *)toFill_local);
    buildChildList(this,rightNode,(ValueVectorOf<xercesc_4_0::QName_*> *)toOptional_local,pVStack_28
                  );
    if (local_40 != (ContentSpecNode *)0x0) {
      buildChildList(this,local_40,(ValueVectorOf<xercesc_4_0::QName_*> *)toOptional_local,
                     pVStack_28);
    }
  }
  else if (leftNode._4_4_ == Leaf) {
    local_48 = ContentSpecNode::getElement((ContentSpecNode *)toFill_local);
    ValueVectorOf<xercesc_4_0::QName_*>::addElement
              ((ValueVectorOf<xercesc_4_0::QName_*> *)pVVar1,&local_48);
    leftNode_1._7_1_ = 0;
    ValueVectorOf<bool>::addElement(pVStack_28,(bool *)((long)&leftNode_1 + 7));
    this->fNumRequired = this->fNumRequired + 1;
  }
  else if (leftNode._4_4_ == ZeroOrOne) {
    local_58 = ContentSpecNode::getFirst((ContentSpecNode *)toFill_local);
    NVar2 = ContentSpecNode::getType(local_58);
    pVVar1 = toOptional_local;
    if (NVar2 != Leaf) {
      pRVar6 = (RuntimeException *)__cxa_allocate_exception(0x30);
      RuntimeException::RuntimeException
                (pRVar6,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/common/AllContentModel.cpp"
                 ,0x158,CM_UnknownCMSpecType,this->fMemoryManager);
      __cxa_throw(pRVar6,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
    }
    local_70[0] = ContentSpecNode::getElement(local_58);
    ValueVectorOf<xercesc_4_0::QName_*>::addElement
              ((ValueVectorOf<xercesc_4_0::QName_*> *)pVVar1,local_70);
    leftNode_2._7_1_ = 1;
    ValueVectorOf<bool>::addElement(pVStack_28,(bool *)((long)&leftNode_2 + 7));
  }
  else {
    if ((leftNode._4_4_ == ZeroOrMore) &&
       (pCVar7 = ContentSpecNode::getFirst((ContentSpecNode *)toFill_local),
       pCVar7 != (ContentSpecNode *)0x0)) {
      pCVar7 = ContentSpecNode::getFirst((ContentSpecNode *)toFill_local);
      NVar2 = ContentSpecNode::getType(pCVar7);
      if (NVar2 == Loop) {
        pCStack_80 = ContentSpecNode::getFirst((ContentSpecNode *)toFill_local);
        buildChildList(this,pCStack_80,(ValueVectorOf<xercesc_4_0::QName_*> *)toOptional_local,
                       pVStack_28);
        return;
      }
    }
    if (leftNode._4_4_ != Loop) {
      pRVar6 = (RuntimeException *)__cxa_allocate_exception(0x30);
      RuntimeException::RuntimeException
                (pRVar6,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/common/AllContentModel.cpp"
                 ,0x177,CM_UnknownCMSpecType,this->fMemoryManager);
      __cxa_throw(pRVar6,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
    }
    for (local_84 = 0; iVar4 = local_84,
        iVar3 = ContentSpecNode::getMinOccurs((ContentSpecNode *)toFill_local),
        pVVar1 = toOptional_local, iVar4 < iVar3; local_84 = local_84 + 1) {
      local_90 = ContentSpecNode::getElement((ContentSpecNode *)toFill_local);
      ValueVectorOf<xercesc_4_0::QName_*>::addElement
                ((ValueVectorOf<xercesc_4_0::QName_*> *)pVVar1,&local_90);
      local_91 = false;
      ValueVectorOf<bool>::addElement(pVStack_28,&local_91);
      this->fNumRequired = this->fNumRequired + 1;
    }
    iVar4 = ContentSpecNode::getMaxOccurs((ContentSpecNode *)toFill_local);
    if (iVar4 != -1) {
      local_84 = 0;
      while( true ) {
        iVar4 = local_84;
        iVar3 = ContentSpecNode::getMaxOccurs((ContentSpecNode *)toFill_local);
        iVar5 = ContentSpecNode::getMinOccurs((ContentSpecNode *)toFill_local);
        pVVar1 = toOptional_local;
        if (iVar3 - iVar5 <= iVar4) break;
        local_a0 = ContentSpecNode::getElement((ContentSpecNode *)toFill_local);
        ValueVectorOf<xercesc_4_0::QName_*>::addElement
                  ((ValueVectorOf<xercesc_4_0::QName_*> *)pVVar1,&local_a0);
        local_a1 = true;
        ValueVectorOf<bool>::addElement(pVStack_28,&local_a1);
        local_84 = local_84 + 1;
      }
    }
  }
  return;
}

Assistant:

void
AllContentModel::buildChildList(ContentSpecNode* const       curNode
                              , ValueVectorOf<QName*>&       toFill
                              , ValueVectorOf<bool>&         toOptional)
{
    // Get the type of spec node our current node is
    const ContentSpecNode::NodeTypes curType = curNode->getType();

    if (curType == ContentSpecNode::All)
    {
        // Get both the child node pointers
        ContentSpecNode* leftNode = curNode->getFirst();
        ContentSpecNode* rightNode = curNode->getSecond();

        // Recurse on the left and right nodes
        buildChildList(leftNode, toFill, toOptional);
        if(rightNode)
            buildChildList(rightNode, toFill, toOptional);
    }
    else if (curType == ContentSpecNode::Leaf)
    {
        // At leaf, add the element to list of elements permitted in the all
        toFill.addElement(curNode->getElement());
        toOptional.addElement(false);
        fNumRequired++;
    }
    else if (curType == ContentSpecNode::ZeroOrOne)
    {
        // At ZERO_OR_ONE node, subtree must be an element
        // that was specified with minOccurs=0, maxOccurs=1
        ContentSpecNode* leftNode = curNode->getFirst();
        if (leftNode->getType() != ContentSpecNode::Leaf)
            ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::CM_UnknownCMSpecType, fMemoryManager);

        toFill.addElement(leftNode->getElement());
        toOptional.addElement(true);
    }
    // only allow ZeroOrMore when it's the father of a Loop
    else if (curType == ContentSpecNode::ZeroOrMore &&
             curNode->getFirst()!=0 &&
             curNode->getFirst()->getType()==ContentSpecNode::Loop)
    {
        ContentSpecNode* leftNode = curNode->getFirst();
        buildChildList(leftNode, toFill, toOptional);
    }
    else if (curType == ContentSpecNode::Loop)
    {
        // At leaf, add the element to list of elements permitted in the all
        int i;
        for(i=0;i<curNode->getMinOccurs();i++)
        {
            toFill.addElement(curNode->getElement());
            toOptional.addElement(false);
            fNumRequired++;
        }
        if(curNode->getMaxOccurs()!=-1)
            for(i=0;i<(curNode->getMaxOccurs() - curNode->getMinOccurs());i++)
            {
                toFill.addElement(curNode->getElement());
                toOptional.addElement(true);
            }
    }
    else
        ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::CM_UnknownCMSpecType, fMemoryManager);
}